

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_nnquant.c
# Opt level: O0

void inxbuild(nn_quant *nnq)

{
  int iVar1;
  nq_pixel *paiVar2;
  nq_pixel *paiVar3;
  int local_38;
  int local_34;
  int startpos;
  int previouscol;
  int *q;
  int *p;
  int smallval;
  int smallpos;
  int j;
  int i;
  nn_quant *nnq_local;
  
  local_34 = 0;
  local_38 = 0;
  for (smallpos = 0; smallpos < nnq->netsize; smallpos = smallpos + 1) {
    paiVar2 = nnq->network + smallpos;
    p._4_4_ = smallpos;
    p._0_4_ = (*paiVar2)[2];
    smallval = smallpos;
    while (smallval = smallval + 1, smallval < nnq->netsize) {
      if (nnq->network[smallval][2] < (int)p) {
        p._4_4_ = smallval;
        p._0_4_ = nnq->network[smallval][2];
      }
    }
    paiVar3 = nnq->network + p._4_4_;
    if (smallpos != p._4_4_) {
      iVar1 = (*paiVar3)[0];
      (*paiVar3)[0] = (*paiVar2)[0];
      (*paiVar2)[0] = iVar1;
      iVar1 = (*paiVar3)[1];
      (*paiVar3)[1] = (*paiVar2)[1];
      (*paiVar2)[1] = iVar1;
      iVar1 = (*paiVar3)[2];
      (*paiVar3)[2] = (*paiVar2)[2];
      (*paiVar2)[2] = iVar1;
      iVar1 = (*paiVar3)[3];
      (*paiVar3)[3] = (*paiVar2)[3];
      (*paiVar2)[3] = iVar1;
      iVar1 = (*paiVar3)[4];
      (*paiVar3)[4] = (*paiVar2)[4];
      (*paiVar2)[4] = iVar1;
    }
    if ((int)p != local_34) {
      nnq->netindex[local_34] = local_38 + smallpos >> 1;
      while (smallval = local_34 + 1, smallval < (int)p) {
        nnq->netindex[smallval] = smallpos;
        local_34 = smallval;
      }
      local_34 = (int)p;
      local_38 = smallpos;
    }
  }
  nnq->netindex[local_34] = local_38 + 0xff >> 1;
  while (smallval = local_34 + 1, smallval < 0x100) {
    nnq->netindex[smallval] = 0xff;
    local_34 = smallval;
  }
  return;
}

Assistant:

void inxbuild(nn_quant *nnq)
{
	register int i,j,smallpos,smallval;
	register int *p,*q;
	int previouscol,startpos;

	previouscol = 0;
	startpos = 0;
	for (i=0; i < nnq->netsize; i++) {
		p = nnq->network[i];
		smallpos = i;
		smallval = p[2];			/* index on g */
		/* find smallest in i..netsize-1 */
		for (j=i+1; j < nnq->netsize; j++) {
			q = nnq->network[j];
			if (q[2] < smallval) {		/* index on g */
				smallpos = j;
				smallval = q[2];	/* index on g */
			}
		}
		q = nnq->network[smallpos];
		/* swap p (i) and q (smallpos) entries */
		if (i != smallpos) {
			j = q[0];
			q[0] = p[0];
			p[0] = j;
			j = q[1];
			q[1] = p[1];
			p[1] = j;
			j = q[2];
			q[2] = p[2];
			p[2] = j;
			j = q[3];
			q[3] = p[3];
			p[3] = j;
			j = q[4];
			q[4] = p[4];
			p[4] = j;
		}
		/* smallval entry is now in position i */
		if (smallval != previouscol) {
			nnq->netindex[previouscol] = (startpos+i)>>1;
			for (j=previouscol+1; j<smallval; j++) nnq->netindex[j] = i;
			previouscol = smallval;
			startpos = i;
		}
	}
	nnq->netindex[previouscol] = (startpos+maxnetpos)>>1;
	for (j=previouscol+1; j<256; j++) nnq->netindex[j] = maxnetpos; /* really 256 */
}